

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O1

void __thiscall
google::protobuf::descriptor_unittest::FeaturesTest_RemovedFeature_Test::
FeaturesTest_RemovedFeature_Test(FeaturesTest_RemovedFeature_Test *this)

{
  testing::Test::Test((Test *)this);
  (this->super_FeaturesTest).super_FeaturesBaseTest.super_Test._vptr_Test =
       (_func_int **)&PTR__ValidationErrorTest_018e2b28;
  DescriptorPool::DescriptorPool(&(this->super_FeaturesTest).super_FeaturesBaseTest.pool_);
  (this->super_FeaturesTest).super_FeaturesBaseTest.super_Test._vptr_Test =
       (_func_int **)&PTR__ValidationErrorTest_018ddb58;
  return;
}

Assistant:

TEST_F(FeaturesTest, RemovedFeature) {
  BuildDescriptorMessagesInTestPool();
  BuildFileInTestPool(pb::TestFeatures::descriptor()->file());
  BuildFileWithErrors(
      R"pb(
        name: "foo.proto"
        syntax: "editions"
        edition: EDITION_2024
        dependency: "google/protobuf/unittest_features.proto"
        options {
          features {
            [pb.test] { removed_feature: VALUE9 }
          }
        }
      )pb",
      "foo.proto: foo.proto: NAME: Feature "
      "pb.TestFeatures.removed_feature has been removed in edition 2024 and "
      "can't be used in edition 2024\n");
}